

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

void free_sh(JSRuntime *rt,JSOSSignalHandler *sh)

{
  list_head *plVar1;
  list_head *plVar2;
  
  plVar1 = (sh->link).prev;
  plVar2 = (sh->link).next;
  plVar1->next = plVar2;
  plVar2->prev = plVar1;
  (sh->link).prev = (list_head *)0x0;
  (sh->link).next = (list_head *)0x0;
  JS_FreeValueRT(rt,sh->func);
  js_free_rt(rt,sh);
  return;
}

Assistant:

static void free_sh(JSRuntime *rt, JSOSSignalHandler *sh)
{
    list_del(&sh->link);
    JS_FreeValueRT(rt, sh->func);
    js_free_rt(rt, sh);
}